

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O2

int MPIABI_Grequest_start
              (MPIABI_Grequest_query_function *query_fn,undefined1 *free_fn,undefined1 *cancel_fn,
              void *extra_state,MPIABI_Request *request)

{
  int iVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x20);
  *puVar2 = query_fn;
  puVar2[1] = free_fn;
  puVar2[2] = cancel_fn;
  puVar2[3] = extra_state;
  iVar1 = MPI_Grequest_start(anon_unknown.dwarf_28dc::forward_query_fn,
                             anon_unknown.dwarf_28dc::forward_free_fn,
                             anon_unknown.dwarf_28dc::forward_cancel_fn,puVar2,request);
  if (iVar1 != 0) {
    operator_delete(puVar2);
  }
  return iVar1;
}

Assistant:

int MPIABI_Grequest_start(MPIABI_Grequest_query_function *query_fn,
                                     MPIABI_Grequest_free_function *free_fn,
                                     MPIABI_Grequest_cancel_function *cancel_fn,
                                     void *extra_state,
                                     MPIABI_Request *request) {
  grequest_state_t *const grequest_state =
      new grequest_state_t{query_fn, free_fn, cancel_fn, extra_state};
  const int ierr =
      MPI_Grequest_start(forward_query_fn, forward_free_fn, forward_cancel_fn,
                         grequest_state, (WPI_RequestPtr)request);
  if (ierr != MPI_SUCCESS)
    delete grequest_state;
  return ierr;
}